

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenFunctionRunPasses
               (BinaryenFunctionRef func,BinaryenModuleRef module,char **passes,
               BinaryenIndex numPasses)

{
  char *pcVar1;
  size_type sVar2;
  mapped_type *__t;
  allocator<char> local_1c1;
  key_type local_1c0;
  allocator<char> local_199;
  key_type local_198;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  allocator<char> local_149;
  string local_148;
  uint local_128;
  BinaryenIndex i;
  undefined1 local_118 [8];
  PassRunner passRunner;
  BinaryenIndex numPasses_local;
  char **passes_local;
  BinaryenModuleRef module_local;
  BinaryenFunctionRef func_local;
  
  passRunner._236_4_ = numPasses;
  wasm::PassRunner::PassRunner((PassRunner *)local_118,module);
  wasm::PassOptions::operator=
            ((PassOptions *)
             &passRunner.passes.
              super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&globalPassOptions);
  for (local_128 = 0; local_128 < (uint)passRunner._236_4_; local_128 = local_128 + 1) {
    pcVar1 = passes[local_128];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,pcVar1,&local_149);
    pcVar1 = passes[local_128];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,pcVar1,&local_199);
    sVar2 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::count(&globalPassOptions.arguments,&local_198);
    if (sVar2 == 0) {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional(&local_178);
    }
    else {
      pcVar1 = passes[local_128];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,pcVar1,&local_1c1);
      __t = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&globalPassOptions.arguments,&local_1c0);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_178,__t);
    }
    wasm::PassRunner::add((PassRunner *)local_118,&local_148,&local_178);
    if (sVar2 == 0) {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_178);
    }
    else {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_178);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator(&local_1c1);
    }
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator(&local_199);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator(&local_149);
  }
  wasm::PassRunner::runOnFunction((PassRunner *)local_118,func);
  wasm::PassRunner::~PassRunner((PassRunner *)local_118);
  return;
}

Assistant:

void BinaryenFunctionRunPasses(BinaryenFunctionRef func,
                               BinaryenModuleRef module,
                               const char** passes,
                               BinaryenIndex numPasses) {
  PassRunner passRunner((Module*)module);
  passRunner.options = globalPassOptions;
  for (BinaryenIndex i = 0; i < numPasses; i++) {
    passRunner.add(passes[i],
                   globalPassOptions.arguments.count(passes[i]) > 0
                     ? globalPassOptions.arguments[passes[i]]
                     : std::optional<std::string>());
  }
  passRunner.runOnFunction((Function*)func);
}